

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpecParser::processNoneChar(TestSpecParser *this,char c)

{
  char c_local;
  TestSpecParser *this_local;
  
  if (c == ' ') {
    this_local._7_1_ = true;
  }
  else if (c == '\"') {
    startNewMode(this,QuotedName);
    this_local._7_1_ = false;
  }
  else if (c == '[') {
    startNewMode(this,Tag);
    this_local._7_1_ = false;
  }
  else if (c == '~') {
    this->m_exclusion = true;
    this_local._7_1_ = false;
  }
  else {
    startNewMode(this,Name);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TestSpecParser::processNoneChar( char c ) {
        switch( c ) {
        case ' ':
            return true;
        case '~':
            m_exclusion = true;
            return false;
        case '[':
            startNewMode( Tag );
            return false;
        case '"':
            startNewMode( QuotedName );
            return false;
        default:
            startNewMode( Name );
            return false;
        }
    }